

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryMaterialProperty
          (AssbinImporter *this,IOStream *stream,aiMaterialProperty *prop)

{
  uint uVar1;
  aiPropertyTypeInfo aVar2;
  DeadlyImportError *this_00;
  char *pcVar3;
  aiString local_45c;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  aiMaterialProperty *local_20;
  aiMaterialProperty *prop_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = prop;
  prop_local = (aiMaterialProperty *)stream;
  stream_local = (IOStream *)this;
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 != 0x123e) {
    local_55 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  Read<unsigned_int>((IOStream *)prop_local);
  Read<aiString>(&local_45c,(IOStream *)prop_local);
  aiString::operator=(&local_20->mKey,&local_45c);
  uVar1 = Read<unsigned_int>((IOStream *)prop_local);
  local_20->mSemantic = uVar1;
  uVar1 = Read<unsigned_int>((IOStream *)prop_local);
  local_20->mIndex = uVar1;
  uVar1 = Read<unsigned_int>((IOStream *)prop_local);
  local_20->mDataLength = uVar1;
  aVar2 = Read<unsigned_int>((IOStream *)prop_local);
  local_20->mType = aVar2;
  pcVar3 = (char *)operator_new__((ulong)local_20->mDataLength);
  local_20->mData = pcVar3;
  (**(code **)(*(long *)&prop_local->mKey + 0x10))
            (prop_local,local_20->mData,1,local_20->mDataLength);
  return;
}

Assistant:

void AssbinImporter::ReadBinaryMaterialProperty(IOStream * stream, aiMaterialProperty* prop) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMATERIALPROPERTY)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    prop->mKey = Read<aiString>(stream);
    prop->mSemantic = Read<unsigned int>(stream);
    prop->mIndex = Read<unsigned int>(stream);

    prop->mDataLength = Read<unsigned int>(stream);
    prop->mType = (aiPropertyTypeInfo)Read<unsigned int>(stream);
    prop->mData = new char [ prop->mDataLength ];
    stream->Read(prop->mData,1,prop->mDataLength);
}